

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *
testing::internal::ActionResultHolder<solitaire::piles::interfaces::StockPile_const&>::
PerformAction<solitaire::piles::interfaces::StockPile_const&()>
          (Action<const_solitaire::piles::interfaces::StockPile_&()> *action,ArgumentTuple *args)

{
  ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *this;
  Result ref;
  Wrapper local_20;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<const_solitaire::piles::interfaces::StockPile_&()> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *)operator_new(0x10);
  ref = Action<const_solitaire::piles::interfaces::StockPile_&()>::Perform
                  ((Action<const_solitaire::piles::interfaces::StockPile_&()> *)args_local);
  ReferenceOrValueWrapper<const_solitaire::piles::interfaces::StockPile_&>::ReferenceOrValueWrapper
            (&local_20,ref);
  ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&>::ActionResultHolder
            (this,local_20);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }